

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ImageButtonEx
               (ImGuiID id,ImTextureID texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
               ImVec2 *padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImU32 IVar6;
  int iVar7;
  int idx;
  ImGuiContext *g;
  float fVar8;
  float fVar9;
  bool held;
  bool hovered;
  ImU32 local_6c;
  ImRect bb;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    bb.Min.x = (pIVar1->DC).CursorPos.x;
    bb.Min.y = (pIVar1->DC).CursorPos.y;
    fVar8 = (*padding).x;
    fVar9 = (*padding).y;
    bb.Max.x = fVar8 + fVar8 + (*size).x + bb.Min.x;
    bb.Max.y = fVar9 + fVar9 + (*size).y + bb.Min.y;
    ItemSize(&bb,-1.0);
    bVar5 = false;
    bVar4 = ItemAdd(&bb,id,(ImRect *)0x0,0);
    if (bVar4) {
      bVar5 = ButtonBehavior(&bb,id,&hovered,&held,0);
      iVar7 = ((held ^ 1U) & hovered) + 0x15;
      idx = 0x17;
      if ((hovered & 1U) == 0) {
        idx = iVar7;
      }
      if (held == false) {
        idx = iVar7;
      }
      local_6c = GetColorU32(idx,1.0);
      RenderNavHighlight(&bb,id,1);
      p_min.y = bb.Min.y;
      p_min.x = bb.Min.x;
      p_max.y = bb.Max.y;
      p_max.x = bb.Max.x;
      fVar8 = padding->x;
      if (padding->y <= padding->x) {
        fVar8 = padding->y;
      }
      fVar9 = (pIVar3->Style).FrameRounding;
      if (fVar8 <= fVar9) {
        fVar9 = fVar8;
      }
      RenderFrame(p_min,p_max,local_6c,true,(float)(~-(uint)(fVar8 < 0.0) & (uint)fVar9));
      if (0.0 < bg_col->w) {
        pIVar2 = pIVar1->DrawList;
        fVar8 = (*padding).x;
        fVar9 = (*padding).y;
        local_38.x = bb.Min.x + fVar8;
        local_38.y = bb.Min.y + fVar9;
        local_40.x = bb.Max.x - fVar8;
        local_40.y = bb.Max.y - fVar9;
        IVar6 = GetColorU32(bg_col);
        ImDrawList::AddRectFilled(pIVar2,&local_38,&local_40,IVar6,0.0,0);
      }
      pIVar2 = pIVar1->DrawList;
      fVar8 = (*padding).x;
      fVar9 = (*padding).y;
      local_38.x = bb.Min.x + fVar8;
      local_38.y = bb.Min.y + fVar9;
      local_40.x = bb.Max.x - fVar8;
      local_40.y = bb.Max.y - fVar9;
      IVar6 = GetColorU32(tint_col);
      ImDrawList::AddImage(pIVar2,texture_id,&local_38,&local_40,uv0,uv1,IVar6);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::ImageButtonEx(ImGuiID id, ImTextureID texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec2& padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size + padding * 2);
    ItemSize(bb);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, ImClamp((float)ImMin(padding.x, padding.y), 0.0f, g.Style.FrameRounding));
    if (bg_col.w > 0.0f)
        window->DrawList->AddRectFilled(bb.Min + padding, bb.Max - padding, GetColorU32(bg_col));
    window->DrawList->AddImage(texture_id, bb.Min + padding, bb.Max - padding, uv0, uv1, GetColorU32(tint_col));

    return pressed;
}